

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

opj_cond_t * opj_cond_create(void)

{
  int iVar1;
  opj_cond_t *cond;
  
  cond = (opj_cond_t *)opj_malloc(0x30);
  if ((pthread_cond_t *)cond == (pthread_cond_t *)0x0) {
    cond = (opj_cond_t *)0x0;
  }
  else {
    iVar1 = pthread_cond_init((pthread_cond_t *)cond,(pthread_condattr_t *)0x0);
    if (iVar1 != 0) {
      opj_free(cond);
      cond = (opj_cond_t *)0x0;
    }
  }
  return cond;
}

Assistant:

opj_cond_t* opj_cond_create(void)
{
    opj_cond_t* cond = (opj_cond_t*) opj_malloc(sizeof(opj_cond_t));
    if (!cond) {
        return NULL;
    }
    if (pthread_cond_init(&(cond->cond), NULL) != 0) {
        opj_free(cond);
        return NULL;
    }
    return cond;
}